

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

bool __thiscall
Assimp::FBX::FBXConverter::IsRedundantAnimationData
          (FBXConverter *this,Model *target,TransformationComp comp,
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          *curves)

{
  float _y;
  const_iterator cVar1;
  bool bVar2;
  size_type sVar3;
  const_reference ppAVar4;
  _Base_ptr this_00;
  reference ppVar5;
  KeyValueList *this_01;
  KeyValueList *this_02;
  const_reference pvVar6;
  PropertyTable *in;
  char *__s;
  float fVar7;
  aiVector3D aVar8;
  aiVector3t<float> aVar9;
  bool local_1f9;
  aiVector3t<float> local_198;
  float local_18c;
  undefined8 uStack_188;
  float epsilon;
  float local_180;
  aiVector3t<float> local_178;
  aiVector3t<float> local_168;
  allocator<char> local_159;
  string local_158;
  aiVector3t<float> local_138;
  aiVector3t<float> *local_128;
  aiVector3D *static_val;
  aiVector3D dyn_val;
  KeyValueList *vz;
  KeyValueList *vy;
  KeyValueList *vx;
  _Self local_f0;
  _Self local_e8;
  allocator<char> local_d9;
  key_type local_d8;
  _Self local_b8;
  const_iterator dz;
  key_type local_a8;
  _Self local_88;
  const_iterator dy;
  allocator<char> local_69;
  key_type local_68;
  _Self local_48;
  const_iterator dx;
  AnimationCurveMap *sub_curves;
  AnimationCurveNode *nd;
  vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
  *curves_local;
  TransformationComp comp_local;
  Model *target_local;
  FBXConverter *this_local;
  
  sVar3 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(curves);
  if (sVar3 == 0) {
    __assert_fail("curves.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXConverter.cpp"
                  ,0xb76,
                  "bool Assimp::FBX::FBXConverter::IsRedundantAnimationData(const Model &, TransformationComp, const std::vector<const AnimationCurveNode *> &)"
                 );
  }
  sVar3 = std::
          vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
          ::size(curves);
  if (sVar3 < 2) {
    ppAVar4 = std::
              vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
              ::front(curves);
    this_00 = (_Base_ptr)AnimationCurveNode::Curves_abi_cxx11_(*ppAVar4);
    dx._M_node = this_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"d|X",&local_69);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                 *)this_00,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    cVar1 = dx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a8,"d|Y",(allocator<char> *)((long)&dz._M_node + 7));
    local_88._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
         ::find(cVar1._M_node,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&dz._M_node + 7));
    cVar1 = dx;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"d|Z",&local_d9);
    local_b8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
         ::find(cVar1._M_node,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
         ::end(dx._M_node);
    bVar2 = std::operator==(&local_48,&local_e8);
    local_1f9 = true;
    if (!bVar2) {
      local_f0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
           ::end(dx._M_node);
      bVar2 = std::operator==(&local_88,&local_f0);
      local_1f9 = true;
      if (!bVar2) {
        vx = (KeyValueList *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>_>
                    *)dx._M_node);
        local_1f9 = std::operator==(&local_b8,(_Self *)&vx);
      }
    }
    if (local_1f9 == false) {
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
               ::operator*(&local_48);
      this_01 = AnimationCurve::GetValues(ppVar5->second);
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
               ::operator*(&local_88);
      this_02 = AnimationCurve::GetValues(ppVar5->second);
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::FBX::AnimationCurve_*>_>
               ::operator*(&local_b8);
      dyn_val._4_8_ = AnimationCurve::GetValues(ppVar5->second);
      sVar3 = std::vector<float,_std::allocator<float>_>::size(this_01);
      if (((sVar3 == 1) &&
          (sVar3 = std::vector<float,_std::allocator<float>_>::size(this_02), sVar3 == 1)) &&
         (sVar3 = std::vector<float,_std::allocator<float>_>::size
                            ((vector<float,_std::allocator<float>_> *)dyn_val._4_8_), sVar3 == 1)) {
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this_01,0);
        fVar7 = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](this_02,0);
        _y = *pvVar6;
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)dyn_val._4_8_,0);
        aiVector3t<float>::aiVector3t((aiVector3t<float> *)((long)&static_val + 4),fVar7,_y,*pvVar6)
        ;
        in = Model::Props(target);
        __s = NameTransformationCompProperty(this,comp);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,__s,&local_159);
        aVar8 = TransformationCompDefaultValue(this,comp);
        local_178.z = aVar8.z;
        local_178._0_8_ = aVar8._0_8_;
        local_168._0_8_ = local_178._0_8_;
        local_168.z = local_178.z;
        aVar9 = PropertyGet<aiVector3t<float>>(in,&local_158,&local_168);
        local_180 = aVar9.z;
        uStack_188 = aVar9._0_8_;
        local_138._0_8_ = uStack_188;
        local_138.z = local_180;
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        local_128 = &local_138;
        local_18c = Math::getEpsilon<float>();
        aVar9 = ::operator-((aiVector3t<float> *)((long)&static_val + 4),local_128);
        local_198.z = aVar9.z;
        local_198._0_8_ = aVar9._0_8_;
        fVar7 = aiVector3t<float>::SquareLength(&local_198);
        return fVar7 < local_18c;
      }
    }
  }
  return false;
}

Assistant:

bool FBXConverter::IsRedundantAnimationData(const Model& target,
            TransformationComp comp,
            const std::vector<const AnimationCurveNode*>& curves) {
            ai_assert(curves.size());

            // look for animation nodes with
            //  * sub channels for all relevant components set
            //  * one key/value pair per component
            //  * combined values match up the corresponding value in the bind pose node transformation
            // only such nodes are 'redundant' for this function.

            if (curves.size() > 1) {
                return false;
            }

            const AnimationCurveNode& nd = *curves.front();
            const AnimationCurveMap& sub_curves = nd.Curves();

            const AnimationCurveMap::const_iterator dx = sub_curves.find("d|X");
            const AnimationCurveMap::const_iterator dy = sub_curves.find("d|Y");
            const AnimationCurveMap::const_iterator dz = sub_curves.find("d|Z");

            if (dx == sub_curves.end() || dy == sub_curves.end() || dz == sub_curves.end()) {
                return false;
            }

            const KeyValueList& vx = (*dx).second->GetValues();
            const KeyValueList& vy = (*dy).second->GetValues();
            const KeyValueList& vz = (*dz).second->GetValues();

            if (vx.size() != 1 || vy.size() != 1 || vz.size() != 1) {
                return false;
            }

            const aiVector3D dyn_val = aiVector3D(vx[0], vy[0], vz[0]);
            const aiVector3D& static_val = PropertyGet<aiVector3D>(target.Props(),
                NameTransformationCompProperty(comp),
                TransformationCompDefaultValue(comp)
                );

            const float epsilon = Math::getEpsilon<float>();
            return (dyn_val - static_val).SquareLength() < epsilon;
        }